

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoder_seek_to_pcm_frame(ma_decoder *pDecoder,ma_uint64 frameIndex)

{
  ma_data_converter *in_RSI;
  ma_uint32 *in_RDI;
  ma_uint64 currentFrameIndex;
  ma_data_source *in_stack_00000008;
  ma_uint32 internalSampleRate;
  ma_uint64 internalFrameIndex;
  ma_result result;
  ma_data_converter *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  ma_uint32 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  ma_data_converter *pDataSource;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  ma_result mVar1;
  
  if (in_RDI == (ma_uint32 *)0x0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else if (*(long *)(in_RDI + 0x12) == 0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    mVar1 = ma_data_source_get_data_format
                      (in_stack_00000008,(ma_format *)currentFrameIndex,
                       (ma_uint32 *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,(ma_channel *)in_RSI,
                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if (mVar1 == MA_SUCCESS) {
      pDataSource = in_RSI;
      if (in_stack_ffffffffffffffd4 != in_RDI[0x24]) {
        in_RSI = (ma_data_converter *)
                 ma_calculate_frame_count_after_resampling
                           (in_stack_ffffffffffffffd4,in_RDI[0x24],(ma_uint64)in_RSI);
      }
      ma_data_source_get_cursor_in_pcm_frames
                (pDataSource,(ma_uint64 *)CONCAT44(mVar1,in_stack_ffffffffffffffe0));
      if (in_stack_ffffffffffffffc8 != in_RSI) {
        mVar1 = ma_data_source_seek_to_pcm_frame
                          (in_RSI,CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        if (mVar1 == MA_SUCCESS) {
          *(ma_data_converter **)(in_RDI + 0x20) = pDataSource;
        }
        ma_data_converter_reset(in_stack_ffffffffffffffc8);
      }
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_decoder_seek_to_pcm_frame(ma_decoder* pDecoder, ma_uint64 frameIndex)
{
    if (pDecoder == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pDecoder->pBackend != NULL) {
        ma_result result;
        ma_uint64 internalFrameIndex;
        ma_uint32 internalSampleRate;
        ma_uint64 currentFrameIndex;

        result = ma_data_source_get_data_format(pDecoder->pBackend, NULL, NULL, &internalSampleRate, NULL, 0);
        if (result != MA_SUCCESS) {
            return result;  /* Failed to retrieve the internal sample rate. */
        }

        if (internalSampleRate == pDecoder->outputSampleRate) {
            internalFrameIndex = frameIndex;
        } else {
            internalFrameIndex = ma_calculate_frame_count_after_resampling(internalSampleRate, pDecoder->outputSampleRate, frameIndex);
        }

        /* Only seek if we're requesting a different frame to what we're currently sitting on. */
        ma_data_source_get_cursor_in_pcm_frames(pDecoder->pBackend, &currentFrameIndex);
        if (currentFrameIndex != internalFrameIndex) {
            result = ma_data_source_seek_to_pcm_frame(pDecoder->pBackend, internalFrameIndex);
            if (result == MA_SUCCESS) {
                pDecoder->readPointerInPCMFrames = frameIndex;
            }

            /* Reset the data converter so that any cached data in the resampler is cleared. */
            ma_data_converter_reset(&pDecoder->converter);
        }

        return result;
    }

    /* Should never get here, but if we do it means onSeekToPCMFrame was not set by the backend. */
    return MA_INVALID_ARGS;
}